

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

MIR_reg_t get_new_ssa_reg(gen_ctx_t gen_ctx,MIR_reg_t reg,int sep,int new_p)

{
  size_t sVar1;
  MIR_reg_t local_2c;
  size_t reg_index;
  int new_p_local;
  int sep_local;
  MIR_reg_t reg_local;
  gen_ctx_t gen_ctx_local;
  
  while( true ) {
    sVar1 = VARR_size_tlength(gen_ctx->ssa_ctx->curr_reg_indexes);
    if (reg < sVar1) break;
    VARR_size_tpush(gen_ctx->ssa_ctx->curr_reg_indexes,0);
  }
  sVar1 = VARR_size_tget(gen_ctx->ssa_ctx->curr_reg_indexes,(ulong)reg);
  VARR_size_tset(gen_ctx->ssa_ctx->curr_reg_indexes,(ulong)reg,sVar1 + 1);
  if ((sVar1 == 0) && (new_p == 0)) {
    local_2c = 0xffffffff;
  }
  else {
    local_2c = get_new_reg(gen_ctx,reg,sep,sVar1);
  }
  return local_2c;
}

Assistant:

static MIR_reg_t get_new_ssa_reg (gen_ctx_t gen_ctx, MIR_reg_t reg, int sep, int new_p) {
  size_t reg_index;

  while (VARR_LENGTH (size_t, curr_reg_indexes) <= reg) VARR_PUSH (size_t, curr_reg_indexes, 0);
  reg_index = VARR_GET (size_t, curr_reg_indexes, reg);
  VARR_SET (size_t, curr_reg_indexes, reg, reg_index + 1);
  return reg_index == 0 && !new_p ? MIR_NON_VAR : get_new_reg (gen_ctx, reg, sep, reg_index);
}